

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O0

void __thiscall ghc::options::options(options *this,int argc,char **argv,size_t offset)

{
  char **__first;
  char **__last;
  char *__s;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d [20];
  allocator<char> local_29;
  size_t local_28;
  size_t offset_local;
  char **argv_local;
  options *poStack_10;
  int argc_local;
  options *this_local;
  
  __s = *argv;
  local_28 = offset;
  offset_local = (size_t)argv;
  argv_local._4_4_ = argc;
  poStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,__s,&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::__cxx11::string::string((string *)&this->_current);
  std::__cxx11::string::string((string *)&this->_next);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator(&this->_argiter);
  __first = (char **)(offset_local + local_28 * 8);
  __last = (char **)(offset_local + (long)argv_local._4_4_ * 8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_3d);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->_cmdargs,
             __first,__last,local_3d);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_3d);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ghc::options::option_info>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ghc::options::option_info>_>_>_>
  ::map(&this->_options);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->_missing_argument_hamdler);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->_unknown_option_handler);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->_positional_handler);
  std::__cxx11::string::string((string *)&this->_positional_description);
  return;
}

Assistant:

options(const int argc, char** argv, size_t offset = 1)
    : _arg0(argv[0])
    , _cmdargs(argv + offset, argv + argc)
    {
    }